

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverCore.c
# Opt level: O0

int Msat_SolverSolve(Msat_Solver_t *p,Msat_IntVec_t *vAssumps,int nBackTrackLimit,int nTimeLimit)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  int *piVar4;
  Msat_Clause_t *pMVar5;
  abctime aVar6;
  int local_68;
  int i;
  int nAssumps;
  int *pAssumps;
  abctime timeStart;
  double dStack_48;
  Msat_Type_t Status;
  double nLearnedLimit;
  double nConflictsLimit;
  Msat_SearchParams_t Params;
  int nTimeLimit_local;
  int nBackTrackLimit_local;
  Msat_IntVec_t *vAssumps_local;
  Msat_Solver_t *p_local;
  
  nConflictsLimit = 0.95;
  Params.dVarDecay = 0.999;
  Params.dClaDecay._0_4_ = nTimeLimit;
  Params.dClaDecay._4_4_ = nBackTrackLimit;
  aVar3 = Abc_Clock();
  if (vAssumps != (Msat_IntVec_t *)0x0) {
    iVar1 = Msat_IntVecReadSize(p->vTrailLim);
    if (iVar1 != 0) {
      __assert_fail("Msat_IntVecReadSize(p->vTrailLim) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/msat/msatSolverCore.c"
                    ,0x98,"int Msat_SolverSolve(Msat_Solver_t *, Msat_IntVec_t *, int, int)");
    }
    iVar1 = Msat_IntVecReadSize(vAssumps);
    piVar4 = Msat_IntVecReadArray(vAssumps);
    for (local_68 = 0; local_68 < iVar1; local_68 = local_68 + 1) {
      iVar2 = Msat_SolverAssume(p,piVar4[local_68]);
      if ((iVar2 == 0) || (pMVar5 = Msat_SolverPropagate(p), pMVar5 != (Msat_Clause_t *)0x0)) {
        Msat_QueueClear(p->pQueue);
        Msat_SolverCancelUntil(p,0);
        return -1;
      }
    }
  }
  iVar1 = Msat_SolverReadDecisionLevel(p);
  p->nLevelRoot = iVar1;
  iVar1 = Msat_ClauseVecReadSize(p->vClauses);
  p->nClausesInit = iVar1;
  nLearnedLimit = 100.0;
  iVar1 = Msat_ClauseVecReadSize(p->vClauses);
  dStack_48 = (double)(iVar1 / 3);
  timeStart._4_4_ = MSAT_UNKNOWN;
  p->nBackTracks = (int)(p->Stats).nConflicts;
  while (timeStart._4_4_ == MSAT_UNKNOWN) {
    if (p->fVerbose != 0) {
      printf("Solving -- conflicts=%d   learnts=%d   progress=%.4f %%\n",p->dProgress * 100.0,
             (ulong)(uint)(int)nLearnedLimit,(ulong)(uint)(int)dStack_48);
    }
    timeStart._4_4_ =
         Msat_SolverSearch(p,(int)nLearnedLimit,(int)dStack_48,Params.dClaDecay._4_4_,
                           (Msat_SearchParams_t *)&nConflictsLimit);
    nLearnedLimit = nLearnedLimit * 1.5;
    dStack_48 = dStack_48 * 1.1;
    if (((0 < Params.dClaDecay._4_4_) &&
        (Params.dClaDecay._4_4_ < (int)(p->Stats).nConflicts - p->nBackTracks)) ||
       ((0 < Params.dClaDecay._0_4_ &&
        (aVar6 = Abc_Clock(),
        SBORROW8(aVar6 - aVar3,(long)Params.dClaDecay._0_4_ * 1000000) ==
        (aVar6 - aVar3) + (long)Params.dClaDecay._0_4_ * -1000000 < 0)))) break;
  }
  Msat_SolverCancelUntil(p,0);
  p->nBackTracks = (int)(p->Stats).nConflicts - p->nBackTracks;
  return timeStart._4_4_;
}

Assistant:

int  Msat_SolverSolve( Msat_Solver_t * p, Msat_IntVec_t * vAssumps, int nBackTrackLimit, int nTimeLimit )
{
    Msat_SearchParams_t Params = { 0.95, 0.999 };
    double nConflictsLimit, nLearnedLimit;
    Msat_Type_t Status;
    abctime timeStart = Abc_Clock();

//    p->pFreq = ABC_ALLOC( int, p->nVarsAlloc );
//    memset( p->pFreq, 0, sizeof(int) * p->nVarsAlloc );
 
    if ( vAssumps )
    {
        int * pAssumps, nAssumps, i;

        assert( Msat_IntVecReadSize(p->vTrailLim) == 0 );

        nAssumps = Msat_IntVecReadSize( vAssumps );
        pAssumps = Msat_IntVecReadArray( vAssumps );
        for ( i = 0; i < nAssumps; i++ )
        {
            if ( !Msat_SolverAssume(p, pAssumps[i]) || Msat_SolverPropagate(p) )
            {
                Msat_QueueClear( p->pQueue );
                Msat_SolverCancelUntil( p, 0 );
                return MSAT_FALSE;
            }
        }
    }
    p->nLevelRoot   = Msat_SolverReadDecisionLevel(p);
    p->nClausesInit = Msat_ClauseVecReadSize( p->vClauses );    
    nConflictsLimit = 100;
    nLearnedLimit   = Msat_ClauseVecReadSize(p->vClauses) / 3;
    Status = MSAT_UNKNOWN;
    p->nBackTracks = (int)p->Stats.nConflicts;
    while ( Status == MSAT_UNKNOWN )
    {
        if ( p->fVerbose )
            printf("Solving -- conflicts=%d   learnts=%d   progress=%.4f %%\n", 
                (int)nConflictsLimit, (int)nLearnedLimit, p->dProgress*100);
        Status = Msat_SolverSearch( p, (int)nConflictsLimit, (int)nLearnedLimit, nBackTrackLimit, &Params );
        nConflictsLimit *= 1.5;
        nLearnedLimit   *= 1.1;
        // if the limit on the number of backtracks is given, quit the restart loop
        if ( nBackTrackLimit > 0 && (int)p->Stats.nConflicts - p->nBackTracks > nBackTrackLimit )
            break;
        // if the runtime limit is exceeded, quit the restart loop
        if ( nTimeLimit > 0 && Abc_Clock() - timeStart >= nTimeLimit * CLOCKS_PER_SEC )
            break;
    }
    Msat_SolverCancelUntil( p, 0 );
    p->nBackTracks = (int)p->Stats.nConflicts - p->nBackTracks;
/*
    ABC_PRT( "True solver runtime", Abc_Clock() - timeStart );
    // print the statistics
    {
        int i, Counter = 0;
        for ( i = 0; i < p->nVars; i++ )
            if ( p->pFreq[i] > 0 )
            {
                printf( "%d ", p->pFreq[i] );
                Counter++;
            }
        if ( Counter )
            printf( "\n" );
        printf( "Total = %d. Used = %d.  Decisions = %d. Imps = %d. Conflicts = %d. ", p->nVars, Counter, (int)p->Stats.nDecisions, (int)p->Stats.nPropagations, (int)p->Stats.nConflicts );
        ABC_PRT( "Time", Abc_Clock() - timeStart );
    }
*/
    return Status;
}